

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<char,_true,_5> __thiscall
immutable::vector<char,_true,_5>::take(vector<char,_true,_5> *this,size_type_conflict elems)

{
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  ref<immutable::rrb<char,_true,_5>_> local_28 [2];
  ref<immutable::rrb<char,_true,_5>_> *prStack_18;
  size_type_conflict elems_local;
  vector<char,_true,_5> *this_local;
  
  prStack_18 = (ref<immutable::rrb<char,_true,_5>_> *)CONCAT44(in_register_00000034,elems);
  this_local = this;
  rrb_slice<char,true,5>((immutable *)local_28,prStack_18,0,in_EDX);
  vector(this,local_28);
  ref<immutable::rrb<char,_true,_5>_>::~ref(local_28);
  return (vector<char,_true,_5>)(ref<immutable::rrb<char,_true,_5>_>)this;
}

Assistant:

vector take(size_type elems) const
        {       
        return rrb_slice(_impl, 0, elems);
        }